

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void measureAllocationSize(sqlite3 *db,void *p)

{
  int iVar1;
  void *p_local;
  sqlite3 *db_local;
  
  iVar1 = sqlite3DbMallocSize(db,p);
  *db->pnBytesFreed = iVar1 + *db->pnBytesFreed;
  return;
}

Assistant:

static SQLITE_NOINLINE void measureAllocationSize(sqlite3 *db, void *p){
  *db->pnBytesFreed += sqlite3DbMallocSize(db,p);
}